

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O2

Reals __thiscall
Omega_h::measure_ents_real_tmpl<2,2>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *coords)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  LO size_in;
  size_t sVar2;
  Reals RVar3;
  allocator local_e2;
  ScopedTimer omega_h_scoped_function_timer;
  Write<double> sizes;
  Write<signed_char> local_c0;
  type f;
  Write<double> local_70;
  LOs ev2v;
  RealSimplexSizes measurer;
  
  std::__cxx11::string::string
            ((string *)&ev2v,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
             ,&local_e2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&measurer,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ev2v,":");
  std::__cxx11::to_string((string *)&sizes,0x35);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&measurer,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sizes);
  begin_code("measure_ents_real_tmpl",(char *)f.a2e.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&sizes);
  std::__cxx11::string::~string((string *)&measurer);
  std::__cxx11::string::~string((string *)&ev2v);
  Write<double>::Write(&local_70,&coords->write_);
  Write<double>::Write((Write<double> *)&measurer,&local_70);
  Write<double>::~Write(&local_70);
  Mesh::ask_verts_of((Mesh *)&ev2v,(Int)mesh);
  pAVar1 = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&f,"",&local_e2);
  size_in = (LO)(sVar2 >> 2);
  Write<double>::Write(&sizes,size_in,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<int>::Write((Write<int> *)&f,&a2e->write_);
  Write<int>::Write(&f.ev2v.write_,&ev2v.write_);
  Write<double>::Write(&f.sizes,&sizes);
  Write<double>::Write((Write<double> *)&f.measurer,(Write<double> *)&measurer);
  parallel_for<Omega_h::measure_ents_real_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (size_in,&f,"measure_ents_real");
  Write<double>::Write(&local_c0,(Write<signed_char> *)&sizes);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_c0);
  Write<double>::~Write((Write<double> *)&local_c0);
  measure_ents_real_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
  Write<double>::~Write(&sizes);
  Write<int>::~Write(&ev2v.write_);
  Write<double>::~Write((Write<double> *)&measurer);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals measure_ents_real_tmpl(Mesh* mesh, LOs a2e, Reals coords) {
  OMEGA_H_TIME_FUNCTION;
  RealSimplexSizes measurer(coords);
  auto ev2v = mesh->ask_verts_of(edim);
  auto na = a2e.size();
  Write<Real> sizes(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<edim + 1>(ev2v, e);
    sizes[a] = measurer.measure<sdim, edim>(v);
  };
  parallel_for(na, f, "measure_ents_real");
  return sizes;
}